

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall dlib::text_box::set_size(text_box *this,unsigned_long width,unsigned_long height)

{
  rectangle *new_rect;
  auto_mutex M;
  auto_mutex local_30;
  
  local_30.r = (this->super_scrollable_region).super_drawable.m;
  local_30.m = (mutex *)0x0;
  local_30.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_30.r,1);
  scrollable_region::set_size(&this->super_scrollable_region,width,height);
  new_rect = scrollable_region::display_rect(&this->super_scrollable_region);
  popup_menu_region::set_rect(&this->right_click_menu,new_rect);
  auto_mutex::unlock(&local_30);
  return;
}

Assistant:

void text_box::
    set_size (
        unsigned long width,
        unsigned long height 
    )
    {        
        auto_mutex M(m);
        scrollable_region::set_size(width,height);
        right_click_menu.set_rect(display_rect());
    }